

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O3

void __thiscall
tchecker::algorithms::ndfs::
algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::dfs_blue
          (algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t> *this,zg_t *ts,
          graph_t *graph,dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels,
          stats_t *stats,node_sptr_t *n)

{
  color_t cVar1;
  node_t *pnVar2;
  blue_stack_entry_t *pbVar3;
  make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
  *pmVar4;
  color_t *pcVar5;
  unsigned_long *puVar6;
  bool *pbVar7;
  overflow_error *poVar8;
  make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
  *pmVar9;
  _Elt_pointer pbVar10;
  node_sptr_t t;
  stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>_>
  stack;
  undefined1 local_f8 [16];
  _Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
  local_e8;
  blue_stack_entry_t local_90;
  
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_f8._8_8_ = labels;
  std::
  _Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
  ::_M_initialize_map(&local_e8,0);
  if ((node_t *)n->_t == (node_t *)0x0) {
LAB_00134aba:
    __assert_fail("_t != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                  ,0x1db,
                  "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t, tchecker::tck_liveness::zg_ndfs::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t, tchecker::tck_liveness::zg_ndfs::edge_t>>]"
                 );
  }
  pcVar5 = ndfs::node_t::color((node_t *)n->_t);
  *pcVar5 = CYAN;
  local_90.n._t =
       (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
        *)0x0;
  pnVar2 = (node_t *)n->_t;
  if ((pnVar2 != (node_t *)0x0) &&
     (pmVar9 = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                *)((long)&(((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                             *)&pnVar2[-1].super_node_flags_t)->_t->
                          super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                          ).super_edge_t.super_edge_vedge_t._vedge._t + 1),
     ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
       *)&pnVar2[-1].super_node_flags_t)->_t = pmVar9,
     pmVar9 == (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                *)0xfffffffffffffffe)) {
    poVar8 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(poVar8,"reference counter overflow");
    __cxa_throw(poVar8,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  local_90.n._t =
       (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
        *)pnVar2;
  expand_node(&local_90.succ,this,ts,graph,n,
              (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8._8_8_);
  local_90.allred = true;
  std::
  deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>>
  ::
  emplace_back<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>
            ((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>>
              *)&local_e8,&local_90);
  std::
  deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
  ::~deque(&local_90.succ);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_90.n);
  puVar6 = stats_t::visited_states_blue(stats);
  *puVar6 = *puVar6 + 1;
  if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pbVar3 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        pbVar10 = pbVar3 + 4;
        if (pbVar3[4].succ.
            super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            pbVar3[4].succ.
            super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_001348d6;
LAB_00134876:
        blue_stack_entry_t::pick_successor((blue_stack_entry_t *)local_f8);
        puVar6 = stats_t::visited_transitions_blue(stats);
        *puVar6 = *puVar6 + 1;
        if ((node_t *)local_f8._0_8_ == (node_t *)0x0) goto LAB_00134aba;
        pcVar5 = ndfs::node_t::color((node_t *)local_f8._0_8_);
        if (*pcVar5 == CYAN) {
          pmVar4 = (pbVar10->n)._t;
          if (pmVar4 == (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                         *)0x0) goto LAB_00134aba;
          if (((pmVar4->
               super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
               ).super_node_t.super_node_t.super_node_flags_t._flags &
              (pmVar4->
              super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
              ).super_node_t.super_node_t.super_node_flags_t.NODE_FINAL) == 0) {
            if ((node_t *)local_f8._0_8_ == (node_t *)0x0) goto LAB_00134aba;
            if (((((node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                    *)local_f8._0_8_)->super_node_t).super_node_t.super_node_flags_t._flags &
                (((node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                   *)local_f8._0_8_)->super_node_t).super_node_t.super_node_flags_t.NODE_FINAL) == 0
               ) goto LAB_00134904;
          }
          pbVar7 = stats_t::cycle(stats);
          *pbVar7 = true;
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t
                    ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                      *)local_f8);
          break;
        }
        if ((node_t *)local_f8._0_8_ == (node_t *)0x0) goto LAB_00134aba;
LAB_00134904:
        pcVar5 = ndfs::node_t::color((node_t *)local_f8._0_8_);
        if (*pcVar5 == WHITE) {
          if ((node_t *)local_f8._0_8_ == (node_t *)0x0) goto LAB_00134aba;
          pcVar5 = ndfs::node_t::color((node_t *)local_f8._0_8_);
          *pcVar5 = CYAN;
          local_90.n._t =
               (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                *)0x0;
          if (((node_t *)local_f8._0_8_ != (node_t *)0x0) &&
             (pmVar9 = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                        *)((long)&(((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                                     *)&((node_t *)(local_f8._0_8_ + -0x20))[3].super_node_flags_t)
                                   ->_t->
                                  super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                                  ).super_edge_t.super_edge_vedge_t._vedge._t + 1),
             ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
               *)&((node_t *)(local_f8._0_8_ + -0x20))[3].super_node_flags_t)->_t = pmVar9,
             pmVar9 == (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                        *)0xfffffffffffffffe)) {
            poVar8 = (overflow_error *)__cxa_allocate_exception(0x10);
            std::overflow_error::overflow_error(poVar8,"reference counter overflow");
            __cxa_throw(poVar8,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
          }
          local_90.n._t =
               (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                *)local_f8._0_8_;
          expand_node(&local_90.succ,this,ts,graph,(node_sptr_t *)local_f8,
                      (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                      local_f8._8_8_);
          local_90.allred = true;
          std::
          deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>>
          ::
          emplace_back<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>
                    ((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>>
                      *)&local_e8,&local_90);
          std::
          deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
          ::~deque(&local_90.succ);
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t(&local_90.n);
          puVar6 = stats_t::visited_states_blue(stats);
          *puVar6 = *puVar6 + 1;
        }
        else {
          if ((node_t *)local_f8._0_8_ == (node_t *)0x0) goto LAB_00134aba;
          pcVar5 = ndfs::node_t::color((node_t *)local_f8._0_8_);
          if (*pcVar5 != RED) {
            pbVar10->allred = false;
          }
        }
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t
                  ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                    *)local_f8);
      }
      else {
        pbVar10 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].succ.
            super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].succ.
            super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00134876;
LAB_001348d6:
        pnVar2 = (node_t *)(pbVar10->n)._t;
        if (pbVar10->allred == true) {
          if (pnVar2 == (node_t *)0x0) goto LAB_00134aba;
          pcVar5 = ndfs::node_t::color(pnVar2);
LAB_00134a1b:
          *pcVar5 = RED;
        }
        else {
          if (pnVar2 == (node_t *)0x0) goto LAB_00134aba;
          if (((pnVar2->super_node_flags_t)._flags & (pnVar2->super_node_flags_t).NODE_FINAL) != 0)
          {
            dfs_red(this,ts,graph,
                    (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8._8_8_,
                    stats,&pbVar10->n);
            pnVar2 = (node_t *)(pbVar10->n)._t;
            if (pnVar2 != (node_t *)0x0) {
              pcVar5 = ndfs::node_t::color(pnVar2);
              goto LAB_00134a1b;
            }
            goto LAB_00134aba;
          }
          pcVar5 = ndfs::node_t::color(pnVar2);
          *pcVar5 = BLUE;
        }
        pnVar2 = (node_t *)(pbVar10->n)._t;
        if (pnVar2 == (node_t *)0x0) goto LAB_00134aba;
        pcVar5 = ndfs::node_t::color(pnVar2);
        cVar1 = *pcVar5;
        std::
        deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
        ::pop_back((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
                    *)&local_e8);
        if (cVar1 != RED) {
          if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
          pbVar10 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pbVar10 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
          }
          pbVar10[-1].allred = false;
        }
      }
    } while (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
  ::~deque((deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::blue_stack_entry_t>_>
            *)&local_e8);
  return;
}

Assistant:

void dfs_blue(TS & ts, GRAPH & graph, boost::dynamic_bitset<> const & labels, tchecker::algorithms::ndfs::stats_t & stats,
                node_sptr_t & n)
  {
    std::stack<blue_stack_entry_t> stack;

    n->color() = tchecker::algorithms::ndfs::CYAN;
    stack.push(blue_stack_entry_t{n, expand_node(ts, graph, n, labels), true});
    ++stats.visited_states_blue();

    while (!stack.empty()) {
      auto && [s, succ, allred] = stack.top();
      if (succ.empty()) {
        if (allred)
          s->color() = tchecker::algorithms::ndfs::RED;
        else if (s->final()) {
          dfs_red(ts, graph, labels, stats, s);
          s->color() = tchecker::algorithms::ndfs::RED;
        }
        else
          s->color() = tchecker::algorithms::ndfs::BLUE;
        bool s_is_red = (s->color() == tchecker::algorithms::ndfs::RED);
        stack.pop();
        if (!s_is_red && !stack.empty())
          stack.top().allred = false;
      }
      else {
        node_sptr_t t = stack.top().pick_successor();
        ++stats.visited_transitions_blue();
        if (t->color() == tchecker::algorithms::ndfs::CYAN && (s->final() || t->final())) {
          stats.cycle() = true;
          break;
        }
        else if (t->color() == tchecker::algorithms::ndfs::WHITE) {
          t->color() = tchecker::algorithms::ndfs::CYAN;
          stack.push(blue_stack_entry_t{t, expand_node(ts, graph, t, labels), true});
          ++stats.visited_states_blue();
        }
        else if (t->color() != tchecker::algorithms::ndfs::RED)
          allred = false;
      }
    }
  }